

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O3

PromiseFromSignal<void_(Object::*)(int,_const_QString_&)>
QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
          (Object *sender,offset_in_Object_to_subr signal)

{
  QSharedData *pQVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RAX;
  PromiseData<int> *extraout_RDX;
  PromiseData<int> *extraout_RDX_00;
  PromiseData<int> *extraout_RDX_01;
  PromiseData<int> *extraout_RDX_02;
  PromiseData<int> *extraout_RDX_03;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> PVar4;
  PromiseResolver<int> resolver;
  QPromiseConnections local_58;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_48;
  QPromise<int> local_40;
  QPromiseConnections local_30;
  
  *(undefined ***)sender = &PTR__QPromiseBase_0012a740;
  puVar2 = (undefined8 *)operator_new(0x68);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  *puVar2 = &PTR__PromiseDataBase_0012aae8;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(puVar2 + 2),0);
  *(undefined1 *)(puVar2 + 3) = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  *puVar2 = &PTR__PromiseData_0012aa80;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  *(undefined8 **)&sender->field_0x8 = puVar2;
  LOCK();
  *(int *)(puVar2 + 1) = *(int *)(puVar2 + 1) + 1;
  UNLOCK();
  local_40.super_QPromiseBase<int>.m_d.d = *(PromiseData<int> **)&sender->field_0x8;
  if (local_40.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_40.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012aa48;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver
            ((PromiseResolver<int> *)
             &local_58.m_d.
              super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_40);
  local_40.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012a740;
  if (local_40.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_40.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_40.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_40.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_58.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_58.m_d.
    super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    LOCK();
    *(int *)&(((QVector<QMetaObject::Connection> *)
              &(local_58.m_d.
                super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d =
         *(int *)&(((QVector<QMetaObject::Connection> *)
                   &(local_58.m_d.
                     super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d + 1;
    UNLOCK();
    local_58.m_d.
    super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_58.m_d.
         super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_58.m_d.
        super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      LOCK();
      *(int *)&(((QVector<QMetaObject::Connection> *)
                &(local_58.m_d.
                  super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d =
           *(int *)&(((QVector<QMetaObject::Connection> *)
                     &(local_58.m_d.
                       super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d + 1;
      UNLOCK();
      local_48.d = (Data *)local_58.m_d.
                           super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
      goto LAB_0010bf16;
    }
  }
  local_48.d = (Data *)0x0;
LAB_0010bf16:
  local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012a848;
  local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_30.m_d.
            super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
  local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_30.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  QtPromisePrivate::connectSignalToResolver<int,Object,void(Object::*)(int,QString_const&)>
            ((QtPromisePrivate *)&local_30,&local_58,(QPromiseResolve<int> *)signal,
             (Object *)Object::twoArgsSignal,0);
  QtPromisePrivate::connectDestroyedToReject<int,Object>
            (&local_30,(QPromiseReject<void> *)&local_48,(Object *)signal);
  QVar3.d = extraout_RDX;
  if (local_30.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_d.
               super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    QVar3.d = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.d !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LOCK();
    *(int *)&(((QVector<QMetaObject::Connection> *)&(local_48.d)->super_QSharedData)->d).d =
         *(int *)&(((QVector<QMetaObject::Connection> *)&(local_48.d)->super_QSharedData)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QVector<QMetaObject::Connection> *)&(local_48.d)->super_QSharedData)->d).d == 0)
    {
      operator_delete(local_48.d,0x10);
      QVar3.d = extraout_RDX_01;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_58.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LOCK();
    *(int *)&((local_58.m_d.
               super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->connections).d.d =
         *(int *)&((local_58.m_d.
                    super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->connections).d.d + -1;
    UNLOCK();
    if (*(int *)&((local_58.m_d.
                   super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->connections).d.d == 0) {
      operator_delete(local_58.m_d.
                      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0x10);
      QVar3.d = extraout_RDX_02;
    }
  }
  if (local_58.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LOCK();
    *(int *)&(((QVector<QMetaObject::Connection> *)
              &(local_58.m_d.
                super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d =
         *(int *)&(((QVector<QMetaObject::Connection> *)
                   &(local_58.m_d.
                     super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QVector<QMetaObject::Connection> *)
                  &(local_58.m_d.
                    super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d == 0) {
      operator_delete(local_58.m_d.
                      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,0x10);
      local_58.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RAX;
      QVar3.d = extraout_RDX_03;
    }
  }
  *(undefined ***)sender = &PTR__QPromiseBase_0012aa48;
  PVar4.super_QPromiseBase<int>.m_d.d = QVar3.d;
  PVar4.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)
       local_58.m_d.
       super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  return (PromiseFromSignal<void_(Object::*)(int,_const_QString_&)>)PVar4.super_QPromiseBase<int>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseFromSignal<Signal>
connect(const Sender* sender, Signal signal)
{
    using namespace QtPromisePrivate;
    using T = typename PromiseFromSignal<Signal>::Type;

    return QPromise<T>{[&](const QPromiseResolve<T>& resolve, const QPromiseReject<T>& reject) {
        QPromiseConnections connections;
        connectSignalToResolver(connections, resolve, sender, signal);
        connectDestroyedToReject(connections, reject, sender);
    }};
}